

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtablewidget.cpp
# Opt level: O1

void QTableWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  QTableModel *pQVar4;
  void **ppvVar5;
  ScrollHint hint;
  int iVar6;
  QTableWidgetItem *item;
  long in_FS_OFFSET;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 0;
    goto LAB_005a3a62;
  case 1:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 1;
    goto LAB_005a3a62;
  case 2:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 2;
    goto LAB_005a3a62;
  case 3:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 3;
    goto LAB_005a3a62;
  case 4:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 4;
    goto LAB_005a3a62;
  case 5:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 5;
    goto LAB_005a3a62;
  case 6:
    currentItemChanged((QTableWidget *)_o,*_a[1],*_a[2]);
    break;
  case 7:
    iVar6 = 7;
    ppvVar5 = (void **)0x0;
LAB_005a3a62:
    QMetaObject::activate(_o,&staticMetaObject,iVar6,ppvVar5);
    break;
  case 8:
    cellPressed((QTableWidget *)_o,*_a[1],*_a[2]);
    break;
  case 9:
    cellClicked((QTableWidget *)_o,*_a[1],*_a[2]);
    break;
  case 10:
    cellDoubleClicked((QTableWidget *)_o,*_a[1],*_a[2]);
    break;
  case 0xb:
    cellActivated((QTableWidget *)_o,*_a[1],*_a[2]);
    break;
  case 0xc:
    cellEntered((QTableWidget *)_o,*_a[1],*_a[2]);
    break;
  case 0xd:
    cellChanged((QTableWidget *)_o,*_a[1],*_a[2]);
    break;
  case 0xe:
    currentCellChanged((QTableWidget *)_o,*_a[1],*_a[2],*_a[3],*_a[4]);
    break;
  case 0xf:
    item = *_a[1];
    hint = *_a[2];
    goto LAB_005a3973;
  case 0x10:
    item = *_a[1];
    hint = EnsureVisible;
LAB_005a3973:
    scrollToItem((QTableWidget *)_o,item,hint);
    break;
  case 0x11:
    insertRow((QTableWidget *)_o,*_a[1]);
    break;
  case 0x12:
    insertColumn((QTableWidget *)_o,*_a[1]);
    break;
  case 0x13:
    removeRow((QTableWidget *)_o,*_a[1]);
    break;
  case 0x14:
    removeColumn((QTableWidget *)_o,*_a[1]);
    break;
  case 0x15:
    clear((QTableWidget *)_o);
    break;
  case 0x16:
    clearContents((QTableWidget *)_o);
  }
  if (_c == ReadProperty) {
switchD_005a380e_caseD_1:
    puVar2 = (undefined4 *)*_a;
    if (_id == 1) {
      local_48 = (void *)0xffffffffffffffff;
      puStack_40 = (undefined8 *)0x0;
      uStack_38 = 0;
      uVar3 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x80))();
LAB_005a3d8f:
      *puVar2 = uVar3;
    }
    else if (_id == 0) {
      local_48 = (void *)0xffffffffffffffff;
      puStack_40 = (undefined8 *)0x0;
      uStack_38 = 0;
      uVar3 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x78))();
      goto LAB_005a3d8f;
    }
    if (_c != WriteProperty) goto switchD_005a380e_caseD_3;
  }
  else if (_c != WriteProperty) {
    if (_c != IndexOfMethod) goto switchD_005a380e_caseD_3;
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == itemPressed) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == itemClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == itemDoubleClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == itemActivated) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == itemEntered) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 4;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == itemChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 5;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == currentItemChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 6;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == itemSelectionChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 7;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == cellPressed) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 8;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == cellClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 9;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == cellDoubleClicked) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 10;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == cellActivated) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0xb;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == cellEntered) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0xc;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == cellChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0xd;
      goto switchD_005a380e_caseD_3;
    }
    if (((code *)*plVar1 == currentCellChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0xe;
      goto switchD_005a380e_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_005a380e_caseD_3;
      goto switchD_005a380e_caseD_1;
    }
  }
  if (_id == 1) {
    iVar6 = **_a;
    pQVar4 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    QTableModel::setColumnCount(pQVar4,iVar6);
  }
  else if (_id == 0) {
    iVar6 = **_a;
    pQVar4 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
    QTableModel::setRowCount(pQVar4,iVar6);
  }
switchD_005a380e_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTableWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[2]))); break;
        case 7: _t->itemSelectionChanged(); break;
        case 8: _t->cellPressed((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->cellClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->cellDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 11: _t->cellActivated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 12: _t->cellEntered((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 13: _t->cellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 14: _t->currentCellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 15: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 16: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1]))); break;
        case 17: _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 18: _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 19: _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 21: _t->clear(); break;
        case 22: _t->clearContents(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * , QTableWidgetItem * )>(_a, &QTableWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)()>(_a, &QTableWidget::itemSelectionChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellPressed, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellClicked, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellDoubleClicked, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellActivated, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellEntered, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellChanged, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int , int , int )>(_a, &QTableWidget::currentCellChanged, 14))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->rowCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRowCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}